

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteControllerLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  ulong local_18;
  size_t a;
  ColladaExporter *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<library_controllers>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PushTag(this);
  for (local_18 = 0; local_18 < this->mScene->mNumMeshes; local_18 = local_18 + 1) {
    WriteController(this,local_18);
  }
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</library_controllers>");
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void ColladaExporter::WriteControllerLibrary()
{
    mOutput << startstr << "<library_controllers>" << endstr;
    PushTag();
    
    for( size_t a = 0; a < mScene->mNumMeshes; ++a) {
        WriteController( a);
    }

    PopTag();
    mOutput << startstr << "</library_controllers>" << endstr;
}